

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShortcutsWindow.cpp
# Opt level: O3

int __thiscall cursespp::ShortcutsWindow::getActiveIndex(ShortcutsWindow *this)

{
  pointer __s2;
  size_t __n;
  element_type *peVar1;
  int iVar2;
  ulong uVar3;
  pointer psVar4;
  uint uVar5;
  
  psVar4 = (this->entries).
           super__Vector_base<std::shared_ptr<cursespp::ShortcutsWindow::Entry>,_std::allocator<std::shared_ptr<cursespp::ShortcutsWindow::Entry>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar5 = (uint)((ulong)((long)(this->entries).
                               super__Vector_base<std::shared_ptr<cursespp::ShortcutsWindow::Entry>,_std::allocator<std::shared_ptr<cursespp::ShortcutsWindow::Entry>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)psVar4) >> 4);
  if (0 < (int)uVar5) {
    __s2 = (this->activeKey)._M_dataplus._M_p;
    __n = (this->activeKey)._M_string_length;
    uVar3 = 0;
    do {
      peVar1 = (psVar4->
               super___shared_ptr<cursespp::ShortcutsWindow::Entry,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      if ((*(size_type *)((long)&peVar1->key + 8) == __n) &&
         ((__n == 0 || (iVar2 = bcmp((peVar1->key)._M_dataplus._M_p,__s2,__n), iVar2 == 0)))) {
        return (int)uVar3;
      }
      uVar3 = uVar3 + 1;
      psVar4 = psVar4 + 1;
    } while ((uVar5 & 0x7fffffff) != uVar3);
  }
  return -1;
}

Assistant:

int ShortcutsWindow::getActiveIndex() {
    for (int i = 0; i < (int) this->entries.size(); i++) {
        if (this->entries[i]->key == this->activeKey) {
            return i;
        }
    }
    return -1;
}